

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O3

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,string *s)

{
  pointer pcVar1;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_60;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171838;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_80 = &local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_48,local_40 + (long)local_48);
  local_60.vtable_ =
       (VTable *)
       internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::
       GetVTable<testing::internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::string>,false>>()
       ::kVTable;
  local_60.buffer_.ptr = operator_new(0x28);
  ((local_60.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(SharedPayloadBase **)(local_60.buffer_.i + 8) = (SharedPayloadBase *)(local_60.buffer_.i + 0x18)
  ;
  if (local_80 == &local_70) {
    *(ulong *)(local_60.buffer_.i + 0x18) = CONCAT71(uStack_6f,local_70);
    *(undefined8 *)(local_60.buffer_.i + 0x20) = uStack_68;
  }
  else {
    *(undefined1 **)(local_60.buffer_.i + 8) = local_80;
    *(ulong *)(local_60.buffer_.i + 0x18) = CONCAT71(uStack_6f,local_70);
  }
  *(undefined8 *)(local_60.buffer_.i + 0x10) = local_78;
  local_78 = 0;
  local_70 = 0;
  local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171838;
  local_80 = &local_70;
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::operator=
            (&this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>,
             &local_60);
  local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171ba0;
  if ((local_60.vtable_ != (VTable *)0x0) &&
     ((local_60.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_60.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_60.buffer_.shared)->ref).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.buffer_.shared)->ref).super___atomic_base<int>._M_i == 0) {
      (*(local_60.vtable_)->shared_destroy)((SharedPayloadBase *)local_60.buffer_.ptr);
    }
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(const std::string& s) { *this = Eq(s); }